

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

bool CastToBool(valtype *vch)

{
  pointer puVar1;
  ulong uVar2;
  ulong uVar3;
  byte in_SIL;
  ulong uVar4;
  long in_FS_OFFSET;
  
  puVar1 = (vch->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (long)(vch->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar1;
  uVar2 = 0;
  do {
    uVar4 = uVar2;
    if (uVar3 <= uVar4) goto LAB_00392795;
    in_SIL = puVar1[uVar4];
    uVar2 = (ulong)((int)uVar4 + 1);
  } while (in_SIL == 0);
  in_SIL = 1;
LAB_00392795:
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return (bool)(uVar4 < uVar3 & in_SIL);
  }
  __stack_chk_fail();
}

Assistant:

bool CastToBool(const valtype& vch)
{
    for (unsigned int i = 0; i < vch.size(); i++)
    {
        if (vch[i] != 0)
        {
            // Can be negative zero
            if (i == vch.size()-1 && vch[i] == 0x80)
                return false;
            return true;
        }
    }
    return false;
}